

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void check_for_missing<ImputedData<int,double>,InputData<float,int>>
               (InputData<float,_int> *input_data,
               vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
               *impute_vec,
               robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *impute_map,int nthreads)

{
  uint uVar1;
  reference pvVar2;
  iterator impute_map_00;
  iterator iVar3;
  unsigned_long uVar4;
  long *in_RDI;
  size_t col_2;
  size_t col_1;
  size_t row;
  size_t ix;
  size_t col;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffffb8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffffc0;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  int nthreads_00;
  
  std::vector<char,_std::allocator<char>_>::assign
            (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,
             (value_type_conflict5 *)0x44bedb);
  if (in_RDI[0xd] != 0) {
    for (local_28 = 0; local_28 < (ulong)in_RDI[1]; local_28 = local_28 + 1) {
      for (local_30 = (ulong)*(int *)(in_RDI[0xd] + local_28 * 4);
          local_30 < (ulong)(long)*(int *)(in_RDI[0xd] + 4 + local_28 * 4); local_30 = local_30 + 1)
      {
        uVar1 = std::isnan((double)(ulong)*(uint *)(in_RDI[0xb] + local_30 * 4));
        if (((uVar1 & 1) != 0) ||
           (uVar1 = std::isinf((double)(ulong)*(uint *)(in_RDI[0xb] + local_30 * 4)),
           (uVar1 & 1) != 0)) {
          pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x13),
                              (long)*(int *)(in_RDI[0xc] + local_30 * 4));
          *pvVar2 = '\x01';
        }
      }
    }
  }
  if ((*in_RDI != 0) || (in_RDI[2] != 0)) {
    for (local_38 = 0; local_38 < (ulong)in_RDI[6]; local_38 = local_38 + 1) {
      if (in_RDI[0xd] == 0) {
        for (in_stack_ffffffffffffffc0._M_current = (char *)0x0;
            in_stack_ffffffffffffffc0._M_current < (char *)in_RDI[1];
            in_stack_ffffffffffffffc0._M_current = in_stack_ffffffffffffffc0._M_current + 1) {
          uVar1 = std::isnan((double)(ulong)*(uint *)(*in_RDI +
                                                     (local_38 +
                                                     (long)in_stack_ffffffffffffffc0._M_current *
                                                     in_RDI[6]) * 4));
          if (((uVar1 & 1) != 0) ||
             (uVar1 = std::isinf((double)(ulong)*(uint *)(*in_RDI +
                                                         (local_38 +
                                                         (long)in_stack_ffffffffffffffc0._M_current
                                                         * in_RDI[6]) * 4)), (uVar1 & 1) != 0)) {
            pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x13),local_38);
            *pvVar2 = '\x01';
            break;
          }
        }
      }
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x13),local_38);
      if (*pvVar2 == '\0') {
        for (in_stack_ffffffffffffffb8._M_current = (char *)0x0;
            in_stack_ffffffffffffffb8._M_current < (char *)in_RDI[5];
            in_stack_ffffffffffffffb8._M_current = in_stack_ffffffffffffffb8._M_current + 1) {
          if (*(int *)(in_RDI[2] +
                      (local_38 + (long)in_stack_ffffffffffffffb8._M_current * in_RDI[6]) * 4) < 0)
          {
            pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x13),local_38);
            *pvVar2 = '\x01';
            break;
          }
        }
      }
    }
  }
  impute_map_00 = std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffffa8);
  iVar3 = std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffffa8);
  nthreads_00 = (int)((ulong)iVar3._M_current >> 0x20);
  uVar4 = std::
          accumulate<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,unsigned_long>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (unsigned_long)impute_map_00._M_current);
  in_RDI[0x16] = uVar4;
  allocate_imp<ImputedData<int,double>,InputData<float,int>>
            ((InputData<float,_int> *)in_stack_ffffffffffffffc0._M_current,
             (vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_> *)
             in_stack_ffffffffffffffb8._M_current,
             (robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *)impute_map_00._M_current,nthreads_00);
  return;
}

Assistant:

void check_for_missing(InputData &input_data,
                       std::vector<ImputedData> &impute_vec,
                       hashed_map<size_t, ImputedData> &impute_map,
                       int nthreads)
{
    input_data.has_missing.assign(input_data.nrows, false);

    if (input_data.Xc_indptr != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(col, input_data)
            for (size_t_for ix = input_data.Xc_indptr[col]; ix < (decltype(ix))input_data.Xc_indptr[col + 1]; ix++)
                if (is_na_or_inf(input_data.Xc[ix]))
                    input_data.has_missing[input_data.Xc_ind[ix]] = true;
            #pragma omp barrier
    }

    if (input_data.numeric_data != NULL || input_data.categ_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) shared(input_data)
        for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
        {
            if (input_data.Xc_indptr == NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    if (is_na_or_inf(input_data.numeric_data[row + col * input_data.nrows]))
                    {
                        input_data.has_missing[row] = true;
                        break;
                    }
                }
            }

            if (!input_data.has_missing[row])
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    if (input_data.categ_data[row + col * input_data.nrows] < 0)
                    {
                        input_data.has_missing[row] = true;
                        break;
                    }
                }
        }
    }

    input_data.n_missing = std::accumulate(input_data.has_missing.begin(), input_data.has_missing.end(), (size_t)0);
    allocate_imp(input_data, impute_vec, impute_map, nthreads);
}